

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_hello_decrypt_esni
              (ptls_context_t *ctx,ptls_iovec_t *server_name,ptls_esni_secret_t **secret,
              st_ptls_client_hello_t *ch)

{
  ptls_esni_context_t **pppVar1;
  uint16_t uVar2;
  ushort uVar3;
  anon_struct_72_2_510fbff9 *paVar4;
  ptls_cipher_suite_t *cipher;
  undefined8 uVar5;
  ptls_aead_context_t *ppVar6;
  int iVar7;
  int iVar8;
  ptls_esni_secret_t *ppVar9;
  uint8_t *__dest;
  size_t sVar10;
  long lVar11;
  ptls_key_exchange_context_t *ppVar12;
  size_t __size;
  anon_struct_72_2_510fbff9 *paVar13;
  ptls_esni_context_t *ppVar14;
  ptls_key_exchange_context_t **pppVar15;
  ptls_esni_context_t **pppVar16;
  bool bVar17;
  ptls_aead_context_t *aead;
  ptls_iovec_t found_name;
  uint8_t *local_58;
  ptls_aead_context_t *local_50;
  ptls_iovec_t *local_48;
  ptls_iovec_t local_40;
  
  local_50 = (st_ptls_aead_context_t *)0x0;
  if (*secret != (ptls_esni_secret_t *)0x0) {
    __assert_fail("*secret == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0xbff,
                  "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                 );
  }
  ppVar9 = (ptls_esni_secret_t *)malloc(0xd0);
  *secret = ppVar9;
  if (ppVar9 == (ptls_esni_secret_t *)0x0) {
    return 0x201;
  }
  local_48 = server_name;
  memset(ppVar9,0,0xd0);
  pppVar16 = ctx->esni;
  ppVar14 = *pppVar16;
  while (ppVar14 != (ptls_esni_context_t *)0x0) {
    paVar4 = ppVar14->cipher_suites;
    iVar8 = 4;
    bVar17 = paVar4->cipher_suite == (ptls_cipher_suite_t *)0x0;
    if (!bVar17) {
      uVar2 = ((ch->esni).cipher)->id;
      if (paVar4->cipher_suite->id == uVar2) {
        lVar11 = 0;
      }
      else {
        lVar11 = 0;
        paVar13 = paVar4;
        do {
          paVar13 = paVar13 + 1;
          bVar17 = paVar13->cipher_suite == (ptls_cipher_suite_t *)0x0;
          if (bVar17) goto LAB_00118524;
          lVar11 = lVar11 + 1;
        } while (paVar13->cipher_suite->id != uVar2);
      }
      if (!bVar17) {
        iVar7 = bcmp(paVar4[lVar11].record_digest,(ch->esni).record_digest,
                     ((ch->esni).cipher)->hash->digest_size);
        iVar8 = 0;
        if (iVar7 == 0) {
          ppVar9->version = ppVar14->version;
          iVar8 = 1;
        }
      }
    }
LAB_00118524:
    if (iVar8 != 0) {
      if (iVar8 == 1) {
        if (ppVar14 == (ptls_esni_context_t *)0x0) goto LAB_001185db;
        pppVar15 = ppVar14->key_exchanges;
        ppVar12 = *pppVar15;
        bVar17 = ppVar12 == (ptls_key_exchange_context_t *)0x0;
        if (bVar17) goto LAB_001185db;
        goto LAB_00118567;
      }
      break;
    }
    pppVar1 = pppVar16 + 1;
    pppVar16 = pppVar16 + 1;
    ppVar14 = *pppVar1;
  }
LAB_00118581:
  iVar8 = 0x2f;
LAB_00118586:
  __dest = (uint8_t *)0x0;
LAB_00118589:
  if (__dest != (uint8_t *)0x0) {
    free(__dest);
  }
  ppVar6 = local_50;
  if (local_50 != (st_ptls_aead_context_t *)0x0) {
    (*local_50->dispose_crypto)(local_50);
    free(ppVar6);
  }
  if ((iVar8 != 0) && (*secret != (ptls_esni_secret_t *)0x0)) {
    free_esni_secret(secret,1);
  }
  return iVar8;
LAB_00118567:
  if (ppVar12->algo->id == ((ch->esni).key_share)->id) goto LAB_001185d7;
  ppVar12 = pppVar15[1];
  bVar17 = ppVar12 == (ptls_key_exchange_context_t *)0x0;
  if (bVar17) goto LAB_00118581;
  pppVar15 = pppVar15 + 1;
  goto LAB_00118567;
LAB_001185d7:
  if (!bVar17) {
    iVar8 = build_esni_contents_hash
                      (((ch->esni).cipher)->hash,ppVar9->esni_contents_hash,(ch->esni).record_digest
                       ,((ch->esni).key_share)->id,(ch->esni).peer_key,ch->random_bytes);
    if (iVar8 != 0) {
      __dest = (uint8_t *)0x0;
      goto LAB_00118589;
    }
    __dest = (uint8_t *)0x0;
    iVar8 = (*(*pppVar15)->on_exchange)(pppVar15,0,&(*secret)->secret,(ch->esni).peer_key);
    if (iVar8 != 0) goto LAB_00118589;
    cipher = (ch->esni).cipher;
    __size = (ulong)(*pppVar16)->padded_length + 0x10;
    if ((ch->esni).encrypted_sni.len - cipher->aead->tag_size == __size) {
      __dest = (uint8_t *)malloc(__size);
      if (__dest != (uint8_t *)0x0) {
        iVar8 = create_esni_aead(&local_50,0,cipher,(*secret)->secret,(*secret)->esni_contents_hash)
        ;
        ppVar6 = local_50;
        if (iVar8 == 0) {
          sVar10 = (*local_50->do_decrypt)
                             (local_50,__dest,(ch->esni).encrypted_sni.base,
                              (ch->esni).encrypted_sni.len,0,(ch->key_shares).base,
                              (ch->key_shares).len);
          iVar8 = 0x33;
          if (sVar10 == (ulong)(*pppVar16)->padded_length + 0x10) {
            (*ppVar6->dispose_crypto)(ppVar6);
            free(ppVar6);
            local_50 = (st_ptls_aead_context_t *)0x0;
            uVar3 = (*pppVar16)->padded_length;
            iVar8 = 0x2f;
            local_58 = __dest;
            if (0xf < (ulong)uVar3) {
              ppVar9 = *secret;
              uVar5 = *(undefined8 *)(__dest + 8);
              *(undefined8 *)ppVar9->nonce = *(undefined8 *)__dest;
              *(undefined8 *)(ppVar9->nonce + 8) = uVar5;
              local_58 = __dest + 0x10;
              iVar8 = client_hello_decode_server_name(&local_40,&local_58,__dest + uVar3);
              if (iVar8 == 0) {
                for (; local_58 != __dest + uVar3; local_58 = local_58 + 1) {
                  if (*local_58 != '\0') {
                    iVar8 = 0x2f;
                    goto LAB_00118589;
                  }
                }
                memmove(__dest,local_40.base,local_40.len);
                local_48->base = __dest;
                local_48->len = local_40.len;
                __dest = (uint8_t *)0x0;
                iVar8 = 0;
              }
            }
          }
        }
        goto LAB_00118589;
      }
      iVar8 = 0x201;
      goto LAB_00118586;
    }
  }
LAB_001185db:
  __dest = (uint8_t *)0x0;
  iVar8 = 0x2f;
  goto LAB_00118589;
}

Assistant:

static int client_hello_decrypt_esni(ptls_context_t *ctx, ptls_iovec_t *server_name, ptls_esni_secret_t **secret,
                                     struct st_ptls_client_hello_t *ch)
{
    ptls_esni_context_t **esni;
    ptls_key_exchange_context_t **key_share_ctx;
    uint8_t *decrypted = NULL;
    ptls_aead_context_t *aead = NULL;
    int ret;

    /* allocate secret */
    assert(*secret == NULL);
    if ((*secret = malloc(sizeof(**secret))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    memset(*secret, 0, sizeof(**secret));

    /* find the matching esni structure */
    for (esni = ctx->esni; *esni != NULL; ++esni) {
        size_t i;
        for (i = 0; (*esni)->cipher_suites[i].cipher_suite != NULL; ++i)
            if ((*esni)->cipher_suites[i].cipher_suite->id == ch->esni.cipher->id)
                break;
        if ((*esni)->cipher_suites[i].cipher_suite == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        if (memcmp((*esni)->cipher_suites[i].record_digest, ch->esni.record_digest, ch->esni.cipher->hash->digest_size) == 0) {
            (*secret)->version = (*esni)->version;
            break;
        }
    }
    if (*esni == NULL) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    /* find the matching private key for ESNI decryption */
    for (key_share_ctx = (*esni)->key_exchanges; *key_share_ctx != NULL; ++key_share_ctx)
        if ((*key_share_ctx)->algo->id == ch->esni.key_share->id)
            break;
    if (*key_share_ctx == NULL) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    /* calculate ESNIContents */
    if ((ret = build_esni_contents_hash(ch->esni.cipher->hash, (*secret)->esni_contents_hash, ch->esni.record_digest,
                                        ch->esni.key_share->id, ch->esni.peer_key, ch->random_bytes)) != 0)
        goto Exit;
    /* derive the shared secret */
    if ((ret = (*key_share_ctx)->on_exchange(key_share_ctx, 0, &(*secret)->secret, ch->esni.peer_key)) != 0)
        goto Exit;
    /* decrypt */
    if (ch->esni.encrypted_sni.len - ch->esni.cipher->aead->tag_size != (*esni)->padded_length + PTLS_ESNI_NONCE_SIZE) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    if ((decrypted = malloc((*esni)->padded_length + PTLS_ESNI_NONCE_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((ret = create_esni_aead(&aead, 0, ch->esni.cipher, (*secret)->secret, (*secret)->esni_contents_hash)) != 0)
        goto Exit;
    if (ptls_aead_decrypt(aead, decrypted, ch->esni.encrypted_sni.base, ch->esni.encrypted_sni.len, 0, ch->key_shares.base,
                          ch->key_shares.len) != (*esni)->padded_length + PTLS_ESNI_NONCE_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ptls_aead_free(aead);
    aead = NULL;

    { /* decode sni */
        const uint8_t *src = decrypted, *const end = src + (*esni)->padded_length;
        ptls_iovec_t found_name;
        if (end - src < PTLS_ESNI_NONCE_SIZE) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        memcpy((*secret)->nonce, src, PTLS_ESNI_NONCE_SIZE);
        src += PTLS_ESNI_NONCE_SIZE;
        if ((ret = client_hello_decode_server_name(&found_name, &src, end)) != 0)
            goto Exit;
        for (; src != end; ++src) {
            if (*src != '\0') {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        }
        /* if successful, reuse memory allocated for padded_server_name for storing the found name (freed by the caller) */
        memmove(decrypted, found_name.base, found_name.len);
        *server_name = ptls_iovec_init(decrypted, found_name.len);
        decrypted = NULL;
    }

    ret = 0;
Exit:
    if (decrypted != NULL)
        free(decrypted);
    if (aead != NULL)
        ptls_aead_free(aead);
    if (ret != 0 && *secret != NULL)
        free_esni_secret(secret, 1);
    return ret;
}